

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_value.c
# Opt level: O2

void * metacall_value_cast_map(void **v)

{
  type_id tVar1;
  value v_00;
  value *ppvVar2;
  
  tVar1 = value_type_id(*v);
  v_00 = *v;
  if (tVar1 != 10) {
    v_00 = value_type_cast(v_00,10);
    if (v_00 == (value)0x0) {
      v_00 = *v;
    }
    else {
      *v = v_00;
    }
  }
  ppvVar2 = value_to_map(v_00);
  return ppvVar2;
}

Assistant:

void *metacall_value_cast_map(void **v)
{
	if (value_type_id(*v) != TYPE_MAP)
	{
		value v_cast = value_type_cast(*v, TYPE_MAP);

		if (v_cast != NULL)
		{
			*v = v_cast;
		}
	}

	return value_to_map(*v);
}